

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void create_new_bb_insns(gen_ctx_t gen_ctx,MIR_insn_t before,MIR_insn_t after,MIR_insn_t insn_for_bb
                        )

{
  MIR_insn_t insn;
  bb_t_conflict bb;
  bb_insn_t_conflict pbVar1;
  bb_insn_t_conflict pbVar2;
  DLIST_MIR_insn_t *pDVar3;
  
  if (insn_for_bb == (MIR_insn_t)0x0) {
    bb = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2);
  }
  else {
    bb = get_insn_bb(gen_ctx,insn_for_bb);
  }
  if (gen_ctx->optimize_level == 0) {
    if (before != (MIR_insn_t)0x0) goto LAB_00138eba;
    pDVar3 = &((gen_ctx->curr_func_item->u).func)->insns;
    while (before = pDVar3->head, before != after) {
      setup_insn_data(gen_ctx,before,bb);
LAB_00138eba:
      pDVar3 = (DLIST_MIR_insn_t *)&(before->insn_link).next;
    }
  }
  else {
    if (before == (MIR_insn_t)0x0) {
      if (after == (MIR_insn_t)0x0) goto LAB_00138e9b;
      pDVar3 = &((gen_ctx->curr_func_item->u).func)->insns;
    }
    else {
      if (((bb_insn_t_conflict)before->data)->bb == bb) {
        pbVar2 = (bb_insn_t_conflict)before->data;
        while (before = (before->insn_link).next, before != after) {
          pbVar1 = create_bb_insn(gen_ctx,before,bb);
          DLIST_bb_insn_t_insert_after(&bb->bb_insns,pbVar2,pbVar1);
          pbVar2 = pbVar1;
        }
        return;
      }
      if (after == (MIR_insn_t)0x0) {
LAB_00138e9b:
        __assert_fail("after != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x295,
                      "void create_new_bb_insns(gen_ctx_t, MIR_insn_t, MIR_insn_t, MIR_insn_t)");
      }
      pDVar3 = (DLIST_MIR_insn_t *)&(before->insn_link).next;
    }
    pbVar2 = (bb_insn_t_conflict)after->data;
    while (insn = pDVar3->head, insn != after) {
      pbVar1 = create_bb_insn(gen_ctx,insn,bb);
      if (bb == pbVar2->bb) {
        DLIST_bb_insn_t_insert_before(&bb->bb_insns,pbVar2,pbVar1);
      }
      else {
        DLIST_bb_insn_t_append(&bb->bb_insns,pbVar1);
      }
      pDVar3 = (DLIST_MIR_insn_t *)&(insn->insn_link).next;
    }
  }
  return;
}

Assistant:

static void create_new_bb_insns (gen_ctx_t gen_ctx, MIR_insn_t before, MIR_insn_t after,
                                 MIR_insn_t insn_for_bb) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, new_bb_insn;
  bb_t bb;

  /* Null insn_for_bb means it should be in the 1st block: skip entry and exit blocks: */
  bb = insn_for_bb == NULL ? DLIST_EL (bb_t, curr_cfg->bbs, 2) : get_insn_bb (gen_ctx, insn_for_bb);
  if (optimize_level == 0) {
    for (insn = (before == NULL ? DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns)
                                : DLIST_NEXT (MIR_insn_t, before));
         insn != after; insn = DLIST_NEXT (MIR_insn_t, insn))
      setup_insn_data (gen_ctx, insn, bb);
    return;
  }
  if (before != NULL && (bb_insn = before->data)->bb == bb) {
    for (insn = DLIST_NEXT (MIR_insn_t, before); insn != after;
         insn = DLIST_NEXT (MIR_insn_t, insn), bb_insn = new_bb_insn) {
      new_bb_insn = create_bb_insn (gen_ctx, insn, bb);
      DLIST_INSERT_AFTER (bb_insn_t, bb->bb_insns, bb_insn, new_bb_insn);
    }
  } else {
    gen_assert (after != NULL);
    bb_insn = after->data;
    insn = (before == NULL ? DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns)
                           : DLIST_NEXT (MIR_insn_t, before));
    for (; insn != after; insn = DLIST_NEXT (MIR_insn_t, insn)) {
      new_bb_insn = create_bb_insn (gen_ctx, insn, bb);
      if (bb == bb_insn->bb)
        DLIST_INSERT_BEFORE (bb_insn_t, bb->bb_insns, bb_insn, new_bb_insn);
      else
        DLIST_APPEND (bb_insn_t, bb->bb_insns, new_bb_insn);
    }
  }
}